

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O1

int __thiscall amrex::AmrLevel::derive(AmrLevel *this,EVP_PKEY_CTX *ctx,uchar *key,size_t *keylen)

{
  _func_int **pp_Var1;
  pointer pSVar2;
  FArrayBox *pFVar3;
  FArrayBox *pFVar4;
  long lVar5;
  long lVar6;
  AmrLevel *pAVar7;
  Geometry *pGVar8;
  Box *pBVar9;
  Real *pRVar10;
  int *piVar11;
  bool bVar12;
  int extraout_EAX;
  int iVar13;
  int iVar14;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  DeriveRec *this_00;
  DeriveBoxMap p_Var15;
  int *piVar16;
  pointer *ppbVar17;
  DeriveFunc p_Var18;
  DeriveFunc3D p_Var19;
  int *piVar20;
  pointer *ppbVar21;
  int iVar22;
  FabArrayBase *pFVar23;
  int dcomp;
  BoxArray *bxs;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  int index;
  int scomp;
  int ncomp;
  FabArrayBase *local_300;
  AmrLevel *local_2f8;
  Real time_local;
  int n_state;
  int n_der;
  int idx;
  Geometry *local_2d8;
  Box *local_2d0;
  Box bx1;
  pointer local_2a8;
  int local_2a0;
  Vector<int,_std::allocator<int>_> *local_290;
  Vector<int,_std::allocator<int>_> *local_288;
  int *local_268;
  Real *local_260;
  Box *local_258;
  IntVect *local_250;
  double *local_248;
  double *local_240;
  int *local_238;
  int *local_230;
  ulong local_228;
  Real dt;
  Box local_214;
  RealBox *local_1f8;
  int *local_1f0;
  long local_1e8;
  _Any_data local_1e0;
  code *local_1d0;
  MultiFab srcMF;
  
  time_local = (Real)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  iVar22 = *(int *)(key + 0xc0);
  bVar12 = isStateVariable((string *)ctx,&index,&scomp);
  if (bVar12) {
    FillPatch(this,(MultiFab *)key,iVar22,time_local,index,scomp,1,(int)keylen);
    iVar22 = extraout_EAX;
  }
  else {
    local_300 = (FabArrayBase *)key;
    local_2f8 = this;
    local_228 = (ulong)keylen & 0xffffffff;
    this_00 = DeriveList::get((DeriveList *)&derive_lst,(string *)ctx);
    if (this_00 == (DeriveRec *)0x0) {
      pp_Var1 = (_func_int **)
                ((long)&srcMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.
                        m_op + 4);
      srcMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase = pp_Var1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&srcMF,"AmrLevel::derive(MultiFab*): unknown variable: ","");
      std::__cxx11::string::_M_append((char *)&srcMF,*(ulong *)ctx);
      Error_host((char *)srcMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                         _vptr_FabArrayBase);
      iVar22 = extraout_EAX_00;
      if (srcMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase != pp_Var1) {
        operator_delete(srcMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase
                        ,srcMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.
                         m_op._4_8_ + 1);
        iVar22 = extraout_EAX_01;
      }
    }
    else {
      DeriveRec::getRange(this_00,0,&index,&scomp,&ncomp);
      pAVar7 = local_2f8;
      pSVar2 = (local_2f8->state).super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
               super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
               super__Vector_impl_data._M_start;
      bxs = &pSVar2[index].grids;
      BATransformer::operator()
                ((Box *)&srcMF,&bxs->m_bat,
                 *(Box **)pSVar2[index].grids.m_ref.
                          super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      p_Var15 = DeriveRec::boxMap(this_00);
      (*p_Var15)(&bx1,(Box *)&srcMF);
      iVar22 = ((int)srcMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase -
               bx1.smallend.vect[0]) + iVar22;
      iVar13 = DeriveRec::numState(this_00);
      bx1.smallend.vect[0] = 1;
      bx1.smallend.vect[1] = 0;
      bx1.smallend.vect[2] = 0;
      bx1.bigend.vect[0] = 0;
      bx1.bigend.vect[1] = 0;
      bx1.bigend.vect[2] = 0;
      stack0xfffffffffffffd50 = (pointer)0x0;
      local_2a8 = (pointer)0x0;
      MultiFab::MultiFab(&srcMF,bxs,&pAVar7->dmap,iVar13,iVar22,(MFInfo *)&bx1,
                         (pAVar7->m_factory)._M_t.
                         super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                         .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                         _M_head_impl);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(bx1.bigend.vect + 1));
      iVar13 = DeriveRec::numRange(this_00);
      if (0 < iVar13) {
        iVar13 = 0;
        dcomp = 0;
        do {
          DeriveRec::getRange(this_00,iVar13,&index,&scomp,&ncomp);
          FillPatch(local_2f8,&srcMF,iVar22,time_local,index,scomp,ncomp,dcomp);
          iVar13 = iVar13 + 1;
          dcomp = dcomp + ncomp;
          iVar14 = DeriveRec::numRange(this_00);
        } while (iVar13 < iVar14);
      }
      DeriveRec::derFuncFab((DeriveFuncFab *)&bx1,this_00);
      pFVar23 = local_300;
      if (bx1.bigend.vect._4_8_ == 0) {
        MFIter::MFIter((MFIter *)&bx1,local_300,true);
        if ((int)local_2a8 < local_2a0) {
          local_1f8 = &(local_2f8->geom).prob_domain;
          local_268 = &local_2f8->level;
          local_260 = (local_2f8->geom).super_CoordSys.dx;
          do {
            ppbVar21 = &local_2a8;
            idx = (local_290->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start[(int)local_2a8];
            ppbVar17 = ppbVar21;
            if (local_288 != (Vector<int,_std::allocator<int>_> *)0x0) {
              ppbVar17 = (pointer *)
                         ((local_288->super_vector<int,_std::allocator<int>_>).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start + (int)local_2a8);
            }
            local_240 = BaseFab<double>::dataPtr
                                  (*(BaseFab<double> **)
                                    (*(long *)((long)&pFVar23[1].boxarray.m_bat.m_op + 0xc) +
                                    (long)*(int *)ppbVar17 * 8),(int)local_228);
            ppbVar17 = ppbVar21;
            if (local_288 != (Vector<int,_std::allocator<int>_> *)0x0) {
              ppbVar17 = (pointer *)
                         ((local_288->super_vector<int,_std::allocator<int>_>).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start + (int)local_2a8);
            }
            lVar5 = *(long *)((long)&pFVar23[1].boxarray.m_bat.m_op + 0xc);
            lVar6 = *(long *)(lVar5 + (long)*(int *)ppbVar17 * 8);
            ppbVar17 = ppbVar21;
            if (local_288 != (Vector<int,_std::allocator<int>_> *)0x0) {
              ppbVar17 = (pointer *)
                         ((local_288->super_vector<int,_std::allocator<int>_>).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start + (int)local_2a8);
            }
            lVar5 = *(long *)(lVar5 + (long)*(int *)ppbVar17 * 8);
            MFIter::growntilebox(&local_214,(MFIter *)&bx1,-1000000);
            n_der = DeriveRec::numDerive(this_00);
            ppbVar17 = ppbVar21;
            if (local_288 != (Vector<int,_std::allocator<int>_> *)0x0) {
              ppbVar17 = (pointer *)
                         ((local_288->super_vector<int,_std::allocator<int>_>).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start + (int)local_2a8);
            }
            local_248 = BaseFab<double>::dataPtr
                                  (&srcMF.super_FabArray<amrex::FArrayBox>.m_fabs_v.
                                    super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start[*(int *)ppbVar17]->
                                    super_BaseFab<double>,0);
            ppbVar17 = ppbVar21;
            if (local_288 != (Vector<int,_std::allocator<int>_> *)0x0) {
              ppbVar17 = (pointer *)
                         ((local_288->super_vector<int,_std::allocator<int>_>).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start + (int)local_2a8);
            }
            pFVar3 = srcMF.super_FabArray<amrex::FArrayBox>.m_fabs_v.
                     super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[*(int *)ppbVar17];
            if (local_288 != (Vector<int,_std::allocator<int>_> *)0x0) {
              ppbVar21 = (pointer *)
                         ((local_288->super_vector<int,_std::allocator<int>_>).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start + (int)local_2a8);
            }
            local_238 = (int *)(lVar6 + 0x18);
            local_230 = (int *)(lVar5 + 0x24);
            local_2d0 = &(pFVar3->super_BaseFab<double>).domain;
            pFVar4 = srcMF.super_FabArray<amrex::FArrayBox>.m_fabs_v.
                     super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[*(int *)ppbVar21];
            local_250 = &(pFVar4->super_BaseFab<double>).domain.bigend;
            local_1e8 = lVar5;
            n_state = DeriveRec::numState(this_00);
            pAVar7 = local_2f8;
            pSVar2 = (local_2f8->state).
                     super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                     super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl
                     .super__Vector_impl_data._M_start;
            local_258 = &pSVar2[index].domain;
            local_2d8 = (Geometry *)&pSVar2[index].domain.bigend;
            local_1f0 = DeriveRec::getBC(this_00);
            pRVar10 = local_260;
            RealBox::RealBox((RealBox *)&local_1e0,&local_214,local_260,local_1f8->xlo);
            dt = (pAVar7->parent->dt_level).super_vector<double,_std::allocator<double>_>.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[pAVar7->level];
            p_Var18 = DeriveRec::derFunc(this_00);
            piVar11 = local_230;
            piVar16 = local_238;
            pBVar9 = local_2d0;
            pGVar8 = local_2d8;
            if (p_Var18 == (DeriveFunc)0x0) {
              p_Var19 = DeriveRec::derFunc3D(this_00);
              if (p_Var19 == (DeriveFunc3D)0x0) {
                Error_host("AmrLevel::derive: no function available");
              }
              else {
                piVar20 = DeriveRec::getBC3D(this_00);
                p_Var19 = DeriveRec::derFunc3D(this_00);
                (*p_Var19)(local_240,piVar16,piVar11,&n_der,local_248,(int *)pBVar9,local_250->vect,
                           &n_state,(int *)&local_214,local_214.bigend.vect,(int *)local_258,
                           (int *)pGVar8,local_260,(Real *)&local_1e0,&time_local,&dt,piVar20,
                           local_268,&idx);
              }
            }
            else {
              p_Var18 = DeriveRec::derFunc(this_00);
              (*p_Var18)(local_240,local_238,(int *)(lVar6 + 0x1c),(int *)(lVar6 + 0x20),local_230,
                         (int *)(local_1e8 + 0x28),(int *)(local_1e8 + 0x2c),&n_der,local_248,
                         (int *)local_2d0,(pFVar3->super_BaseFab<double>).domain.smallend.vect + 1,
                         (pFVar3->super_BaseFab<double>).domain.smallend.vect + 2,local_250->vect,
                         (pFVar4->super_BaseFab<double>).domain.bigend.vect + 1,
                         (pFVar4->super_BaseFab<double>).domain.bigend.vect + 2,&n_state,
                         (int *)&local_214,local_214.bigend.vect,(int *)local_258,(int *)local_2d8,
                         pRVar10,(Real *)&local_1e0,&time_local,&dt,local_1f0,local_268,&idx);
            }
            pFVar23 = local_300;
            MFIter::operator++((MFIter *)&bx1);
          } while ((int)local_2a8 < local_2a0);
        }
      }
      else {
        (*(code *)bx1.bigend.vect._4_8_)(&bx1,&bx1,3);
        pFVar23 = local_300;
        MFIter::MFIter((MFIter *)&bx1,local_300,true);
        if ((int)local_2a8 < local_2a0) {
          local_2d8 = &local_2f8->geom;
          do {
            MFIter::growntilebox(&local_214,(MFIter *)&bx1,-1000000);
            ppbVar17 = &local_2a8;
            if (local_288 != (Vector<int,_std::allocator<int>_> *)0x0) {
              ppbVar17 = (pointer *)
                         ((local_288->super_vector<int,_std::allocator<int>_>).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start + (int)local_2a8);
            }
            pFVar3 = *(FArrayBox **)
                      (*(long *)((long)&pFVar23[1].boxarray.m_bat.m_op + 0xc) +
                      (long)*(int *)ppbVar17 * 8);
            ppbVar17 = &local_2a8;
            if (local_288 != (Vector<int,_std::allocator<int>_> *)0x0) {
              ppbVar17 = (pointer *)
                         ((local_288->super_vector<int,_std::allocator<int>_>).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start + (int)local_2a8);
            }
            pFVar4 = srcMF.super_FabArray<amrex::FArrayBox>.m_fabs_v.
                     super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[*(int *)ppbVar17];
            iVar22 = DeriveRec::numDerive(this_00);
            DeriveRec::derFuncFab((DeriveFuncFab *)&local_1e0,this_00);
            local_2d0 = (Box *)time_local;
            piVar16 = DeriveRec::getBC(this_00);
            std::
            function<void_(const_amrex::Box_&,_amrex::FArrayBox_&,_int,_int,_const_amrex::FArrayBox_&,_const_amrex::Geometry_&,_double,_const_int_*,_int)>
            ::operator()((function<void_(const_amrex::Box_&,_amrex::FArrayBox_&,_int,_int,_const_amrex::FArrayBox_&,_const_amrex::Geometry_&,_double,_const_int_*,_int)>
                          *)&local_1e0,&local_214,pFVar3,(int)local_228,iVar22,pFVar4,local_2d8,
                         (double)local_2d0,piVar16,local_2f8->level);
            if (local_1d0 != (code *)0x0) {
              (*local_1d0)(&local_1e0,&local_1e0,__destroy_functor);
            }
            MFIter::operator++((MFIter *)&bx1);
            pFVar23 = local_300;
          } while ((int)local_2a8 < local_2a0);
        }
      }
      MFIter::~MFIter((MFIter *)&bx1);
      MultiFab::~MultiFab(&srcMF);
      iVar22 = extraout_EAX_02;
    }
  }
  return iVar22;
}

Assistant:

void
AmrLevel::derive (const std::string& name, Real time, MultiFab& mf, int dcomp)
{
    BL_ASSERT(dcomp < mf.nComp());

    const int ngrow = mf.nGrow();

    int index, scomp, ncomp;

    if (isStateVariable(name,index,scomp))
    {
        FillPatch(*this,mf,ngrow,time,index,scomp,1,dcomp);
    }
    else if (const DeriveRec* rec = derive_lst.get(name))
    {
        rec->getRange(0,index,scomp,ncomp);

        const BoxArray& srcBA = state[index].boxArray();

        int ngrow_src = ngrow;
        {
            Box bx0 = srcBA[0];
            Box bx1 = rec->boxMap()(bx0);
            int g = bx0.smallEnd(0) - bx1.smallEnd(0);
            ngrow_src += g;
        }

        MultiFab srcMF(srcBA,dmap,rec->numState(),ngrow_src, MFInfo(), *m_factory);

        for (int k = 0, dc = 0; k < rec->numRange(); k++, dc += ncomp)
        {
            rec->getRange(k,index,scomp,ncomp);

            FillPatch(*this,srcMF,ngrow_src,time,index,scomp,ncomp,dc);
        }

        if (rec->derFuncFab() != nullptr)
        {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(mf,TilingIfNotGPU()); mfi.isValid(); ++mfi)
            {
                const Box& bx = mfi.growntilebox();
                FArrayBox& derfab = mf[mfi];
                FArrayBox const& datafab = srcMF[mfi];
                const int dncomp = rec->numDerive();
                rec->derFuncFab()(bx, derfab, dcomp, dncomp, datafab, geom, time, rec->getBC(), level);
            }
        }
        else
        {
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
        for (MFIter mfi(mf,true); mfi.isValid(); ++mfi)
        {
            int         idx     = mfi.index();
            Real*       ddat    = mf[mfi].dataPtr(dcomp);
            const int*  dlo     = mf[mfi].loVect();
            const int*  dhi     = mf[mfi].hiVect();
            const Box&  gtbx    = mfi.growntilebox();
            const int*  lo      = gtbx.loVect();
            const int*  hi      = gtbx.hiVect();
            int         n_der   = rec->numDerive();
            Real*       cdat    = srcMF[mfi].dataPtr();
            const int*  clo     = srcMF[mfi].loVect();
            const int*  chi     = srcMF[mfi].hiVect();
            int         n_state = rec->numState();
            const int*  dom_lo  = state[index].getDomain().loVect();
            const int*  dom_hi  = state[index].getDomain().hiVect();
            const Real* dx      = geom.CellSize();
            const int*  bcr     = rec->getBC();
            const RealBox& temp = RealBox(gtbx,geom.CellSize(),geom.ProbLo());
            const Real* xlo     = temp.lo();
            Real        dt      = parent->dtLevel(level);

            if (rec->derFunc() != static_cast<DeriveFunc>(0)){
               rec->derFunc()(ddat,AMREX_ARLIM(dlo),AMREX_ARLIM(dhi),&n_der,
                              cdat,AMREX_ARLIM(clo),AMREX_ARLIM(chi),&n_state,
                              lo,hi,dom_lo,dom_hi,dx,xlo,&time,&dt,bcr,
                              &level,&idx);
            } else if (rec->derFunc3D() != static_cast<DeriveFunc3D>(0)){
               const int *bc3D = rec->getBC3D();
               rec->derFunc3D()(ddat,AMREX_ARLIM_3D(dlo),AMREX_ARLIM_3D(dhi),&n_der,
                                cdat,AMREX_ARLIM_3D(clo),AMREX_ARLIM_3D(chi),&n_state,
                                AMREX_ARLIM_3D(lo),AMREX_ARLIM_3D(hi),
                                AMREX_ARLIM_3D(dom_lo),AMREX_ARLIM_3D(dom_hi),
                                AMREX_ZFILL(dx),AMREX_ZFILL(xlo),
                                &time,&dt,
                                bc3D,
                                &level,&idx);
            } else {
               amrex::Error("AmrLevel::derive: no function available");
            }
        }
        }
    }
    else
    {
        //
        // If we got here, cannot derive given name.
        //
        std::string msg("AmrLevel::derive(MultiFab*): unknown variable: ");
        msg += name;
        amrex::Error(msg.c_str());
    }
}